

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshSelectWeights4(word *t,int nVars,int *pW)

{
  int iVar1;
  int iVar2;
  int local_34;
  int nMints;
  int Lmax;
  int Lmin;
  int m;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 4) {
    __assert_fail("nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xbe,"int Extra_ThreshSelectWeights4(word *, int, int *)");
  }
  pW[3] = 1;
  do {
    if (4 < pW[3]) {
      return 0;
    }
    pW[2] = pW[3];
    while (pW[2] < 5) {
      pW[1] = pW[2];
      while (pW[1] < 5) {
        *pW = pW[1];
        while (*pW < 5) {
          nMints = 10000;
          local_34 = 0;
          for (Lmax = 0; Lmax < iVar1; Lmax = Lmax + 1) {
            iVar2 = Abc_TtGetBit(t,Lmax);
            if (iVar2 == 0) {
              iVar2 = Extra_ThreshWeightedSum(pW,4,Lmax);
              local_34 = Abc_MaxInt(local_34,iVar2);
            }
            else {
              iVar2 = Extra_ThreshWeightedSum(pW,4,Lmax);
              nMints = Abc_MinInt(nMints,iVar2);
            }
            if (nMints <= local_34) break;
          }
          if (iVar1 <= Lmax) {
            if (local_34 < nMints) {
              return nMints;
            }
            __assert_fail("Lmax < Lmin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                          ,0xd1,"int Extra_ThreshSelectWeights4(word *, int, int *)");
          }
          *pW = *pW + 1;
        }
        pW[1] = pW[1] + 1;
      }
      pW[2] = pW[2] + 1;
    }
    pW[3] = pW[3] + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights4(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars);
    assert(nVars == 4);
    for (pW[3] = 1; pW[3] <= nVars; pW[3]++)
        for (pW[2] = pW[3]; pW[2] <= nVars; pW[2]++)
            for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
                for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
                    Lmin = 10000;
                    Lmax = 0;
                    for (m = 0; m < nMints; m++) {
                        if (Abc_TtGetBit(t, m))
                            Lmin = Abc_MinInt(Lmin,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        else
                            Lmax = Abc_MaxInt(Lmax,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        if (Lmax >= Lmin)
                            break;
                    }
                    if (m < nMints)
                        continue;
                    assert(Lmax < Lmin);
                    return Lmin;
                }
    return 0;
}